

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O1

void rhash_sha256_update(sha256_ctx *ctx,uchar *msg,size_t size)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  size_t __n;
  sha256_ctx *block;
  ulong uVar8;
  ulong uVar9;
  sha256_ctx *__src;
  bool bVar10;
  
  uVar8 = ctx->length;
  ctx->length = uVar8 + size;
  uVar8 = uVar8 & 0x3f;
  if (uVar8 != 0) {
    uVar9 = 0x40 - uVar8;
    __n = size;
    if (uVar9 < size) {
      __n = uVar9;
    }
    memcpy((void *)((long)ctx->message + uVar8),msg,__n);
    bVar10 = size < uVar9;
    size = size - uVar9;
    if (bVar10) {
      return;
    }
    rhash_sha256_process_block(ctx->hash,ctx->message);
    msg = msg + uVar9;
  }
  __src = (sha256_ctx *)msg;
  if (0x3f < size) {
    do {
      block = __src;
      if (((ulong)msg & 3) != 0) {
        uVar1 = *(undefined8 *)__src->message;
        uVar2 = *(undefined8 *)(__src->message + 2);
        uVar3 = *(undefined8 *)(__src->message + 4);
        uVar4 = *(undefined8 *)(__src->message + 6);
        uVar5 = *(undefined8 *)(__src->message + 8);
        uVar6 = *(undefined8 *)(__src->message + 10);
        uVar7 = *(undefined8 *)(__src->message + 0xe);
        *(undefined8 *)(ctx->message + 0xc) = *(undefined8 *)(__src->message + 0xc);
        *(undefined8 *)(ctx->message + 0xe) = uVar7;
        *(undefined8 *)(ctx->message + 8) = uVar5;
        *(undefined8 *)(ctx->message + 10) = uVar6;
        *(undefined8 *)(ctx->message + 4) = uVar3;
        *(undefined8 *)(ctx->message + 6) = uVar4;
        *(undefined8 *)ctx->message = uVar1;
        *(undefined8 *)(ctx->message + 2) = uVar2;
        block = ctx;
      }
      rhash_sha256_process_block(ctx->hash,block->message);
      __src = (sha256_ctx *)&__src->length;
      size = size - 0x40;
    } while (0x3f < size);
  }
  if (size == 0) {
    return;
  }
  memcpy(ctx,__src,size);
  return;
}

Assistant:

void rhash_sha256_update(sha256_ctx *ctx, const unsigned char *msg, size_t size)
{
	size_t index = (size_t)ctx->length & 63;
	ctx->length += size;

	/* fill partial block */
	if (index) {
		size_t left = sha256_block_size - index;
		memcpy((char*)ctx->message + index, msg, (size < left ? size : left));
		if (size < left) return;

		/* process partial block */
		rhash_sha256_process_block(ctx->hash, (unsigned*)ctx->message);
		msg  += left;
		size -= left;
	}
	while (size >= sha256_block_size) {
		unsigned* aligned_message_block;
		if (IS_ALIGNED_32(msg)) {
			/* the most common case is processing of an already aligned message
			without copying it */
			aligned_message_block = (unsigned*)msg;
		} else {
			memcpy(ctx->message, msg, sha256_block_size);
			aligned_message_block = (unsigned*)ctx->message;
		}

		rhash_sha256_process_block(ctx->hash, aligned_message_block);
		msg  += sha256_block_size;
		size -= sha256_block_size;
	}
	if (size) {
		memcpy(ctx->message, msg, size); /* save leftovers */
	}
}